

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

void __thiscall re2::DFA::StateToWorkq(DFA *this,State *s,Workq *q)

{
  int i;
  long lVar1;
  
  (q->super_SparseSet).size_ = 0;
  q->nextmark_ = q->n_;
  for (lVar1 = 0; lVar1 < s->ninst_; lVar1 = lVar1 + 1) {
    if (s->inst_[lVar1] == -1) {
      Workq::mark(q);
    }
    else {
      AddToQueue(this,q,s->inst_[lVar1],s->flag_ & 0xfff);
    }
  }
  return;
}

Assistant:

void DFA::StateToWorkq(State* s, Workq* q) {
  q->clear();
  for (int i = 0; i < s->ninst_; i++) {
    if (s->inst_[i] == Mark)
      q->mark();
    else
      // Explore from the head of the list.
      AddToQueue(q, s->inst_[i], s->flag_ & kFlagEmptyMask);
  }
}